

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall
amrex::FabArrayBase::CPC::define
          (CPC *this,BoxArray *ba_dst,DistributionMapping *dm_dst,
          Vector<int,_std::allocator<int>_> *imap_dst,BoxArray *ba_src,DistributionMapping *dm_src,
          Vector<int,_std::allocator<int>_> *imap_src,int MyProc)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *this_00
  ;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar4;
  undefined8 uVar5;
  Box *pBVar6;
  pointer ppVar7;
  bool bVar8;
  IndexType IVar9;
  mapped_type *pmVar10;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *puVar11;
  _Rb_tree_node_base *p_Var12;
  int iVar13;
  Box *b;
  pointer pBVar14;
  pointer pIVar15;
  int ipass;
  int iVar16;
  pointer piVar17;
  ulong uVar18;
  Box *btile;
  pointer piVar19;
  pointer pBVar20;
  CPC *pCVar21;
  int src_owner;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxList bl_local;
  int dst_owner;
  Box r;
  Box r_1;
  BoxList bl_remote;
  Box r_4;
  Box result_1;
  Box r_3;
  int local_26c;
  _Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_268;
  ulong local_250;
  ulong local_248;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_240;
  long local_238;
  ulong local_230;
  CPC *local_228;
  Box *local_220;
  BoxList local_218;
  BoxList local_1f8;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *local_1d8;
  IntVect *local_1d0;
  BoxArray *local_1c8;
  IntVect *local_1c0;
  DistributionMapping *local_1b8;
  DistributionMapping *local_1b0;
  BoxArray local_1a8;
  BoxList local_138;
  undefined1 local_118 [12];
  int iStack_10c;
  int iStack_108;
  undefined8 uStack_104;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_f8;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *local_e0;
  Vector<int,_std::allocator<int>_> *local_d8;
  ulong local_d0;
  ulong local_c8;
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  *local_c0;
  Box *local_b8;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  undefined8 uStack_a4;
  _Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
  local_98;
  IndexType IStack_90;
  int iStack_8c;
  int iStack_88;
  undefined8 uStack_84;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
  *local_74;
  uint uStack_6c;
  int iStack_68;
  int iStack_64;
  undefined8 uStack_60;
  Box local_58;
  
  local_1c8 = ba_src;
  local_1b8 = dm_src;
  local_1b0 = dm_dst;
  std::
  make_unique<std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>
            ();
  uVar5 = local_1a8.m_bat._0_8_;
  local_c0 = &(this->super_CommMetaData).m_LocTags;
  local_1a8.m_bat._0_8_ =
       (__uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           *)local_c0,(pointer)uVar5);
  std::
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                 *)&local_1a8);
  std::
  make_unique<std::map<int,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>>>
            ();
  uVar5 = local_1a8.m_bat._0_8_;
  local_e0 = &(this->super_CommMetaData).m_SndTags;
  local_1a8.m_bat._0_8_ =
       (__uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           *)local_e0,(pointer)uVar5);
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)&local_1a8);
  std::
  make_unique<std::map<int,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>>>
            ();
  uVar5 = local_1a8.m_bat._0_8_;
  local_1d8 = &(this->super_CommMetaData).m_RcvTags;
  local_1a8.m_bat._0_8_ =
       (__uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           *)local_1d8,(pointer)uVar5);
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)&local_1a8);
  piVar2 = (imap_dst->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar3 = (imap_dst->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar2 == piVar3) {
    piVar19 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    piVar17 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    if (piVar19 == piVar17) {
      return;
    }
  }
  else {
    piVar19 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    piVar17 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  local_268._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = imap_dst;
  Periodicity::shiftIntVect
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_f8,&this->m_period);
  local_1d0 = &this->m_srcng;
  local_250 = (ulong)((long)piVar3 - (long)piVar2) >> 2;
  local_1c0 = &this->m_dstng;
  uVar18 = (ulong)((long)piVar17 - (long)piVar19) >> 2;
  local_220 = (Box *)(this->super_CommMetaData).m_SndTags._M_t.
                     super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                     ._M_head_impl;
  local_248 = uVar18 & 0xffffffff;
  if ((int)uVar18 < 1) {
    local_248 = 0;
  }
  local_228 = this;
  for (local_240 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                    *)0x0;
      local_240 !=
      (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
       *)local_248;
      local_240 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                   *)((long)local_240 + 1)) {
    iVar16 = (imap_src->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [(long)local_240];
    BoxArray::operator[]((Box *)&local_1a8,local_1c8,iVar16);
    iStack_108 = local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
    uStack_104 = local_1a8.m_bat.m_op._16_8_;
    local_118._0_8_ = local_1a8.m_bat._0_8_;
    local_118._8_4_ = local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype;
    iStack_10c = local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
    Box::grow((Box *)local_118,local_1d0);
    local_238 = (long)iVar16;
    for (pIVar15 = local_f8._M_impl.super__Vector_impl_data._M_start;
        pIVar15 != local_f8._M_impl.super__Vector_impl_data._M_finish; pIVar15 = pIVar15 + 1) {
      local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = iStack_108;
      local_1a8.m_bat.m_op._16_8_ = uStack_104;
      local_1a8.m_bat._0_8_ = local_118._0_8_;
      local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)local_118._8_4_;
      local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = iStack_10c;
      Box::operator+=((Box *)&local_1a8,pIVar15);
      BoxArray::intersections
                (ba_dst,(Box *)&local_1a8,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )&local_268,false,local_1c0);
      uVar18 = (ulong)((long)local_268._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_268._M_impl.super__Vector_impl_data._M_start) >> 5;
      local_230 = uVar18 & 0xffffffff;
      if ((int)uVar18 < 1) {
        local_230 = 0;
      }
      for (uVar18 = 0; uVar18 != local_230; uVar18 = uVar18 + 1) {
        iVar1 = local_268._M_impl.super__Vector_impl_data._M_start[uVar18].first;
        iVar13 = *(int *)(*(long *)&(((local_1b0->m_ref).
                                      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl +
                         (long)iVar1 * 4);
        local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_1f8.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,iVar13);
        if (iVar13 < 0) {
          iVar13 = 0;
        }
        else {
          iVar13 = iVar13 - iVar13 % (int)ParallelDescriptor::m_Team._4_4_;
        }
        if ((ParallelDescriptor::m_Team._12_4_ != iVar13) &&
           (*(int *)(*(long *)&(((local_1b8->m_ref).
                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl + local_238 * 4
                    ) == MyProc)) {
          ppVar7 = local_268._M_impl.super__Vector_impl_data._M_start + uVar18;
          if (local_228->m_tgco == true) {
            BoxArray::operator[]((Box *)&local_1a8,ba_dst,iVar1);
            boxDiff(&local_218,&ppVar7->second,(Box *)&local_1a8);
            pBVar14 = local_218.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pBVar20 = local_218.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            BoxList::BoxList(&local_218,&ppVar7->second);
            pBVar14 = local_218.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pBVar20 = local_218.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          for (; pBVar14 != pBVar20; pBVar14 = pBVar14 + 1) {
            pmVar10 = std::
                      map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                      ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                    *)local_220,(key_type *)&local_1f8);
            local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start = *(pointer *)(pBVar14->smallend).vect;
            uVar5 = *(undefined8 *)((pBVar14->smallend).vect + 2);
            local_138._20_8_ = *(undefined8 *)((pBVar14->bigend).vect + 2);
            local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)((ulong)*(undefined8 *)(pBVar14->bigend).vect >> 0x20);
            local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = (int)uVar5;
            local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)uVar5 >> 0x20);
            Box::operator-=((Box *)&local_138,pIVar15);
            local_1a8.m_bat._0_8_ = *(undefined8 *)(pBVar14->smallend).vect;
            uVar5 = *(undefined8 *)(pBVar14->bigend).vect;
            local_1a8.m_bat.m_op._16_8_ = *(undefined8 *)((pBVar14->bigend).vect + 2);
            local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype =
                 SUB84(*(undefined8 *)((pBVar14->smallend).vect + 2),0);
            local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)uVar5;
            local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = (int)((ulong)uVar5 >> 0x20);
            local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[2] =
                 (int)local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            local_1a8.m_bat.m_op._44_8_ = local_138._20_8_;
            local_1a8.m_bat.m_op._24_8_ =
                 local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[0] =
                 (int)local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[1] =
                 local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_;
            local_1a8.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar1;
            local_1a8.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar16;
            std::
            vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
            ::emplace_back<amrex::FabArrayBase::CopyComTag>(pmVar10,(CopyComTag *)&local_1a8);
          }
          std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                    ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_218);
        }
      }
    }
  }
  local_240 = (local_1d8->_M_t).
              super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              .
              super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
              ._M_head_impl;
  IVar9 = BATransformer::index_type(&ba_dst->m_bat);
  BoxList::BoxList(&local_218,IVar9);
  IVar9 = BATransformer::index_type(&ba_dst->m_bat);
  BoxList::BoxList((BoxList *)local_118,IVar9);
  local_238 = CONCAT44(local_238._4_4_,ParallelDescriptor::m_Team._4_4_);
  iVar16 = (int)local_250;
  local_250 = local_250 & 0xffffffff;
  if (iVar16 < 1) {
    local_250 = 0;
  }
  uVar18 = 0;
  pCVar21 = local_228;
  while (uVar18 != local_250) {
    iVar16 = (local_d8->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [uVar18];
    local_d0 = uVar18;
    BoxArray::operator[]((Box *)&local_74,ba_dst,iVar16);
    iStack_88 = iStack_64;
    uStack_84 = uStack_60;
    local_98._M_head_impl = local_74;
    IStack_90.itype = uStack_6c;
    iStack_8c = iStack_68;
    Box::grow((Box *)&local_98,local_1c0);
    local_230 = (ulong)iVar16;
    for (pIVar15 = local_f8._M_impl.super__Vector_impl_data._M_start;
        pIVar15 != local_f8._M_impl.super__Vector_impl_data._M_finish; pIVar15 = pIVar15 + 1) {
      local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = iStack_88;
      local_1a8.m_bat.m_op._16_8_ = uStack_84;
      local_1a8.m_bat._0_8_ = local_98._M_head_impl;
      local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)IStack_90.itype;
      local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = iStack_8c;
      Box::operator+=((Box *)&local_1a8,pIVar15);
      BoxArray::intersections
                (local_1c8,(Box *)&local_1a8,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )&local_268,false,local_1d0);
      uVar18 = (ulong)((long)local_268._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_268._M_impl.super__Vector_impl_data._M_start) >> 5;
      local_c8 = uVar18 & 0xffffffff;
      if ((int)uVar18 < 1) {
        local_c8 = 0;
      }
      uVar18 = 0;
      while (uVar18 != local_c8) {
        iVar1 = local_268._M_impl.super__Vector_impl_data._M_start[uVar18].first;
        local_58.smallend.vect._0_8_ =
             *(undefined8 *)
              local_268._M_impl.super__Vector_impl_data._M_start[uVar18].second.smallend.vect;
        uVar5 = *(undefined8 *)
                 (local_268._M_impl.super__Vector_impl_data._M_start[uVar18].second.smallend.vect +
                 2);
        local_58._20_8_ =
             *(undefined8 *)
              (local_268._M_impl.super__Vector_impl_data._M_start[uVar18].second.bigend.vect + 2);
        local_58.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)
                           local_268._M_impl.super__Vector_impl_data._M_start[uVar18].second.bigend.
                           vect >> 0x20);
        local_58.smallend.vect[2] = (int)uVar5;
        local_58.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
        local_248 = uVar18;
        Box::operator-=(&local_58,pIVar15);
        local_26c = *(int *)(*(long *)&(((local_1b8->m_ref).
                                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl +
                            (long)iVar1 * 4);
        if (pCVar21->m_tgco == true) {
          boxDiff(&local_138,&local_58,(Box *)&local_74);
        }
        else {
          BoxList::BoxList(&local_138,&local_58);
        }
        local_220 = (Box *)CONCAT44(local_138.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (int)local_138.m_lbox.
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
        for (pBVar20 = local_138.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start; pBVar20 != local_220; pBVar20 = pBVar20 + 1
            ) {
          bVar8 = ParallelDescriptor::sameTeam(local_26c,MyProc);
          if (bVar8) {
            BoxList::BoxList(&local_1f8,pBVar20,(IntVect *)&comm_tile_size);
            pBVar6 = (Box *)CONCAT44(local_1f8.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     (int)local_1f8.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
            for (pBVar14 = local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start; pBVar14 != pBVar6;
                pBVar14 = pBVar14 + 1) {
              this_00 = (local_c0->_M_t).
                        super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                        .
                        super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                        ._M_head_impl;
              local_b8 = *(Box **)(pBVar14->smallend).vect;
              uVar5 = *(undefined8 *)((pBVar14->smallend).vect + 2);
              uStack_a4 = *(undefined8 *)((pBVar14->bigend).vect + 2);
              iStack_a8 = (int)((ulong)*(undefined8 *)(pBVar14->bigend).vect >> 0x20);
              iStack_b0 = (int)uVar5;
              iStack_ac = (int)((ulong)uVar5 >> 0x20);
              Box::operator+=((Box *)&local_b8,pIVar15);
              local_1a8.m_bat._0_8_ = *(undefined8 *)(pBVar14->smallend).vect;
              uVar5 = *(undefined8 *)(pBVar14->bigend).vect;
              local_1a8.m_bat.m_op._16_8_ = *(undefined8 *)((pBVar14->bigend).vect + 2);
              local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype =
                   SUB84(*(undefined8 *)((pBVar14->smallend).vect + 2),0);
              local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)uVar5;
              local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = (int)((ulong)uVar5 >> 0x20);
              local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[2] = iStack_a8;
              local_1a8.m_bat.m_op._44_8_ = uStack_a4;
              local_1a8.m_bat.m_op._24_8_ = local_b8;
              local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[0] = iStack_b0;
              local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[1] = iStack_ac;
              local_1a8.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar16;
              local_1a8.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar1;
              std::
              vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
              ::emplace_back<amrex::FabArrayBase::CopyComTag>(this_00,(CopyComTag *)&local_1a8);
            }
            if (1 < (int)local_238) {
              std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                        ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&local_218,pBVar20);
            }
            std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                      ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_1f8);
            pCVar21 = local_228;
          }
          else if (*(int *)(*(long *)&(((local_1b0->m_ref).
                                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl +
                           local_230 * 4) == MyProc) {
            pmVar10 = std::
                      map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                      ::operator[](local_240,&local_26c);
            local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start = *(pointer *)(pBVar20->smallend).vect;
            uVar5 = *(undefined8 *)((pBVar20->smallend).vect + 2);
            local_1f8._20_8_ = *(undefined8 *)((pBVar20->bigend).vect + 2);
            local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)((ulong)*(undefined8 *)(pBVar20->bigend).vect >> 0x20);
            local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = (int)uVar5;
            local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)uVar5 >> 0x20);
            Box::operator+=((Box *)&local_1f8,pIVar15);
            local_1a8.m_bat._0_8_ = *(undefined8 *)(pBVar20->smallend).vect;
            uVar5 = *(undefined8 *)(pBVar20->bigend).vect;
            local_1a8.m_bat.m_op._16_8_ = *(undefined8 *)((pBVar20->bigend).vect + 2);
            local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype =
                 SUB84(*(undefined8 *)((pBVar20->smallend).vect + 2),0);
            local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)uVar5;
            local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = (int)((ulong)uVar5 >> 0x20);
            local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[2] =
                 (int)local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            local_1a8.m_bat.m_op._44_8_ = local_1f8._20_8_;
            local_1a8.m_bat.m_op._24_8_ =
                 local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[0] =
                 (int)local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            local_1a8.m_bat.m_op.m_bndryReg.m_hishft.vect[1] =
                 local_1f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_;
            local_1a8.m_bat.m_op.m_bndryReg.m_doilo.vect[2] = iVar16;
            local_1a8.m_bat.m_op.m_bndryReg.m_doihi.vect[0] = iVar1;
            std::
            vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
            ::emplace_back<amrex::FabArrayBase::CopyComTag>(pmVar10,(CopyComTag *)&local_1a8);
          }
        }
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_138);
        uVar18 = local_248 + 1;
      }
    }
    uVar18 = local_d0 + 1;
  }
  if ((long)local_218.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_218.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start < 0x38) {
    (pCVar21->super_CommMetaData).m_threadsafe_loc = true;
  }
  else {
    BoxArray::BoxArray(&local_1a8,&local_218);
    bVar8 = BoxArray::isDisjoint(&local_1a8);
    (pCVar21->super_CommMetaData).m_threadsafe_loc = bVar8;
    BoxArray::~BoxArray(&local_1a8);
  }
  if (CONCAT44(iStack_10c,local_118._8_4_) - local_118._0_8_ < 0x38) {
    (pCVar21->super_CommMetaData).m_threadsafe_rcv = true;
  }
  else {
    BoxArray::BoxArray(&local_1a8,(BoxList *)local_118);
    bVar8 = BoxArray::isDisjoint(&local_1a8);
    (pCVar21->super_CommMetaData).m_threadsafe_rcv = bVar8;
    BoxArray::~BoxArray(&local_1a8);
  }
  for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
    puVar11 = local_1d8;
    if (iVar16 == 0) {
      puVar11 = local_e0;
    }
    pmVar4 = (puVar11->_M_t).
             super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             .
             super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
             ._M_head_impl;
    for (p_Var12 = *(_Base_ptr *)((long)&(pmVar4->_M_t)._M_impl + 0x18);
        p_Var12 != (_Rb_tree_node_base *)((long)&(pmVar4->_M_t)._M_impl + 8U);
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var12[1]._M_parent,p_Var12[1]._M_left);
    }
  }
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)local_118);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_218);
  std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_f8);
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&local_268);
  return;
}

Assistant:

void
FabArrayBase::CPC::define (const BoxArray& ba_dst, const DistributionMapping& dm_dst,
                           const Vector<int>& imap_dst,
                           const BoxArray& ba_src, const DistributionMapping& dm_src,
                           const Vector<int>& imap_src,
                           int MyProc)
{
    BL_PROFILE("FabArrayBase::CPC::define()");

    BL_ASSERT(ba_dst.size() > 0 && ba_src.size() > 0);
    BL_ASSERT(ba_dst.ixType() == ba_src.ixType());

    m_LocTags = std::make_unique<CopyComTag::CopyComTagsContainer>();
    m_SndTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();
    m_RcvTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();

    if (!(imap_dst.empty() && imap_src.empty()))
    {
        const int nlocal_src = imap_src.size();
        const IntVect& ng_src = m_srcng;
        const int nlocal_dst = imap_dst.size();
        const IntVect& ng_dst = m_dstng;

        std::vector< std::pair<int,Box> > isects;

        const std::vector<IntVect>& pshifts = m_period.shiftIntVect();

        auto& send_tags = *m_SndTags;

        for (int i = 0; i < nlocal_src; ++i)
        {
            const int   k_src = imap_src[i];
            const Box& bx_src = amrex::grow(ba_src[k_src], ng_src);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_dst.intersections(bx_src+(*pit), isects, false, ng_dst);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_dst     = isects[j].first;
                    const Box& bx       = isects[j].second;
                    const int dst_owner = dm_dst[k_dst];

                    if (ParallelDescriptor::sameTeam(dst_owner)) {
                        continue; // local copy will be dealt with later
                    } else if (MyProc == dm_src[k_src]) {
                        BoxList const bl_dst = m_tgco ? boxDiff(bx, ba_dst[k_dst]) : BoxList(bx);
                        for (auto const& b : bl_dst) {
                            send_tags[dst_owner].push_back(CopyComTag(b, b-(*pit), k_dst, k_src));
                        }
                    }
                }
            }
        }

        auto& recv_tags = *m_RcvTags;

        BoxList bl_local(ba_dst.ixType());
        BoxList bl_remote(ba_dst.ixType());

        bool check_local = false, check_remote = false;
#if defined(AMREX_USE_GPU)
        check_local = true;
        check_remote = true;
#elif defined(AMREX_USE_OMP)
        if (omp_get_max_threads() > 1) {
            check_local = true;
            check_remote = true;
        }
#endif

        if (ParallelDescriptor::TeamSize() > 1) {
            check_local = true;
        }

        for (int i = 0; i < nlocal_dst; ++i)
        {
            const int   k_dst = imap_dst[i];
            const Box& bx_dst_valid = ba_dst[k_dst];
            const Box& bx_dst = amrex::grow(bx_dst_valid, ng_dst);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_src.intersections(bx_dst+(*pit), isects, false, ng_src);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_src     = isects[j].first;
                    const Box& bx       = isects[j].second - *pit;
                    const int src_owner = dm_src[k_src];

                    BoxList const bl_dst = m_tgco ? boxDiff(bx,bx_dst_valid) : BoxList(bx);
                    for (auto const& b : bl_dst) {
                        if (ParallelDescriptor::sameTeam(src_owner, MyProc)) { // local copy
                            const BoxList tilelist(b, FabArrayBase::comm_tile_size);
                            for (auto const& btile : tilelist) {
                                m_LocTags->push_back(CopyComTag(btile, btile+(*pit), k_dst, k_src));
                            }
                            if (check_local) {
                                bl_local.push_back(b);
                            }
                        } else if (MyProc == dm_dst[k_dst]) {
                            recv_tags[src_owner].push_back(CopyComTag(b, b+(*pit), k_dst, k_src));
                            if (check_remote) {
                                bl_remote.push_back(b);
                            }
                        }
                    }
                }
            }
        }

        if (bl_local.size() <= 1) {
            m_threadsafe_loc = true;
        } else {
            m_threadsafe_loc = BoxArray(std::move(bl_local)).isDisjoint();
        }

        if (bl_remote.size() <= 1) {
            m_threadsafe_rcv = true;
        } else {
            m_threadsafe_rcv = BoxArray(std::move(bl_remote)).isDisjoint();
        }

        for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
        {
            CopyComTag::MapOfCopyComTagContainers & Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
            for (auto& kv : Tags)
            {
                std::vector<CopyComTag>& cctv = kv.second;
                // We need to fix the order so that the send and recv processes match.
                std::sort(cctv.begin(), cctv.end());
            }
        }
    }
}